

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

void __thiscall S2Polygon::Shape::Init(Shape *this,S2Polygon *polygon)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  
  this->polygon_ = polygon;
  if (this->cumulative_edges_ != (int *)0x0) {
    operator_delete__(this->cumulative_edges_);
  }
  this->cumulative_edges_ = (int *)0x0;
  *(undefined4 *)&(this->super_S2Shape).field_0xc = 0;
  puVar1 = (polygon->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(polygon->loops_).
                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if ((((uVar3 & 0x7fffffff8) != 8) ||
      (_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
            (puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
      *(int *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                     super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) != 1)) ||
     ((*(byte *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) == 0)) {
    uVar6 = (uint)(uVar3 >> 3);
    if ((int)uVar6 < 0xd) {
      if ((int)uVar6 < 1) {
        return;
      }
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)operator_new__(uVar3 >> 1 & 0x1fffffffc);
      this->cumulative_edges_ = piVar4;
    }
    iVar5 = 0;
    uVar3 = 0;
    do {
      if (piVar4 != (int *)0x0) {
        piVar4[uVar3] = iVar5;
      }
      iVar5 = iVar5 + *(int *)((long)puVar1[uVar3]._M_t.
                                     super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>.
                                     _M_t + 0xc);
      uVar3 = uVar3 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar3);
    *(int *)&(this->super_S2Shape).field_0xc = iVar5;
  }
  return;
}

Assistant:

void S2Polygon::Shape::Init(const S2Polygon* polygon) {
  polygon_ = polygon;
  delete[] cumulative_edges_;
  cumulative_edges_ = nullptr;
  num_edges_ = 0;
  if (!polygon->is_full()) {
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    int num_loops = polygon->num_loops();
    if (num_loops > kMaxLinearSearchLoops) {
      cumulative_edges_ = new int[num_loops];
    }
    for (int i = 0; i < num_loops; ++i) {
      if (cumulative_edges_) cumulative_edges_[i] = num_edges_;
      num_edges_ += polygon->loop(i)->num_vertices();
    }
  }
}